

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

void lj_meta_for(lua_State *L,TValue *o)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = o->it64 >> 0x2f;
  if ((0xfffffffffffffff2 < uVar2) &&
     ((uVar2 != 0xfffffffffffffffb ||
      (iVar1 = lj_strscan_num((GCstr *)(o->it64 & 0x7fffffffffff),o), iVar1 == 0)))) {
    lj_err_msg(L,LJ_ERR_FORINIT);
  }
  uVar2 = o[1].it64 >> 0x2f;
  if ((0xfffffffffffffff2 < uVar2) &&
     ((uVar2 != 0xfffffffffffffffb ||
      (iVar1 = lj_strscan_num((GCstr *)(o[1].it64 & 0x7fffffffffff),o + 1), iVar1 == 0)))) {
    lj_err_msg(L,LJ_ERR_FORLIM);
  }
  uVar2 = o[2].it64 >> 0x2f;
  if (uVar2 < 0xfffffffffffffff3) {
    return;
  }
  if ((uVar2 == 0xfffffffffffffffb) &&
     (iVar1 = lj_strscan_num((GCstr *)(o[2].it64 & 0x7fffffffffff),o + 2), iVar1 != 0)) {
    return;
  }
  lj_err_msg(L,LJ_ERR_FORSTEP);
}

Assistant:

void LJ_FASTCALL lj_meta_for(lua_State *L, TValue *o)
{
  if (!lj_strscan_numberobj(o)) lj_err_msg(L, LJ_ERR_FORINIT);
  if (!lj_strscan_numberobj(o+1)) lj_err_msg(L, LJ_ERR_FORLIM);
  if (!lj_strscan_numberobj(o+2)) lj_err_msg(L, LJ_ERR_FORSTEP);
  if (LJ_DUALNUM) {
    /* Ensure all slots are integers or all slots are numbers. */
    int32_t k[3];
    int nint = 0;
    ptrdiff_t i;
    for (i = 0; i <= 2; i++) {
      if (tvisint(o+i)) {
	k[i] = intV(o+i); nint++;
      } else {
	k[i] = lj_num2int(numV(o+i)); nint += ((lua_Number)k[i] == numV(o+i));
      }
    }
    if (nint == 3) {  /* Narrow to integers. */
      setintV(o, k[0]);
      setintV(o+1, k[1]);
      setintV(o+2, k[2]);
    } else if (nint != 0) {  /* Widen to numbers. */
      if (tvisint(o)) setnumV(o, (lua_Number)intV(o));
      if (tvisint(o+1)) setnumV(o+1, (lua_Number)intV(o+1));
      if (tvisint(o+2)) setnumV(o+2, (lua_Number)intV(o+2));
    }
  }
}